

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O3

void __thiscall
QListWidgetItem::QListWidgetItem(QListWidgetItem *this,QString *text,QListWidget *listview,int type)

{
  QListWidget *pQVar1;
  int row;
  QListWidgetItemPrivate *pQVar2;
  QListModel *this_00;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QListWidgetItem = (_func_int **)&PTR__QListWidgetItem_0080e440;
  this->rtti = type;
  this->view = listview;
  pQVar2 = (QListWidgetItemPrivate *)operator_new(0x28);
  pQVar2->q = this;
  (pQVar2->values).d.d = (Data *)0x0;
  (pQVar2->values).d.ptr = (QWidgetItemData *)0x0;
  (pQVar2->values).d.size = 0;
  pQVar2->theid = -1;
  this->d = pQVar2;
  (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
       0x35;
  this_00 = listModel(this);
  pQVar1 = this->view;
  if (pQVar1 != (QListWidget *)0x0) {
    QObject::blockSignals(SUB81(pQVar1,0));
  }
  if (this_00 != (QListModel *)0x0) {
    QObject::blockSignals(SUB81(this_00,0));
  }
  ::QVariant::QVariant((QVariant *)&local_58,(QString *)text);
  (*this->_vptr_QListWidgetItem[4])(this,0,&local_58);
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (this_00 != (QListModel *)0x0) {
    QObject::blockSignals(SUB81(this_00,0));
  }
  if (pQVar1 != (QListWidget *)0x0) {
    QObject::blockSignals(SUB81(pQVar1,0));
  }
  if (this_00 != (QListModel *)0x0) {
    local_58._forAlignment = -NAN;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    row = (**(code **)(*(long *)this_00 + 0x78))(this_00);
    QListModel::insert(this_00,row,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QListWidgetItem::QListWidgetItem(const QString &text, QListWidget *listview, int type)
    : rtti(type), view(listview), d(new QListWidgetItemPrivate(this)),
      itemFlags(Qt::ItemIsSelectable
                |Qt::ItemIsUserCheckable
                |Qt::ItemIsEnabled
                |Qt::ItemIsDragEnabled)
{
    QListModel *model = listModel();
    {
        QSignalBlocker b(view);
        QSignalBlocker bm(model);
        setData(Qt::DisplayRole, text);
    }
    if (model)
        model->insert(model->rowCount(), this);
}